

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

void quantize_row_q5_K_ref(float *x,block_q5_K *y,int64_t k)

{
  float *pfVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  short sVar8;
  float fVar9;
  block_q5_K *pbVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  byte bVar13;
  int l;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  float *pfVar18;
  int j;
  long lVar19;
  long lVar20;
  uint8_t *puVar21;
  uint8_t *puVar22;
  uint8_t *puVar23;
  int j_3;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  uint8_t *puVar27;
  bool bVar28;
  float fVar29;
  undefined4 extraout_XMM0_Db;
  uint uVar31;
  undefined1 auVar30 [16];
  uint uVar32;
  uint uVar35;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar36;
  uint uVar38;
  float fVar39;
  undefined1 auVar37 [16];
  short sVar40;
  float fVar41;
  float fVar48;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  uint uVar49;
  uint uVar51;
  undefined1 auVar50 [16];
  float scales [8];
  float mins [8];
  uint8_t Laux [32];
  float weights [32];
  uint8_t L [256];
  char cVar3;
  char cVar4;
  char cVar5;
  undefined4 uVar42;
  undefined6 uVar43;
  
  lVar14 = k + 0xff;
  if (-1 < k) {
    lVar14 = k;
  }
  if (0xff < k) {
    puVar21 = y->scales + 4;
    puVar27 = y->qh;
    lVar20 = 0;
    do {
      lVar19 = 0;
      auVar30 = ZEXT816(0);
      pfVar18 = x;
      do {
        fVar29 = 0.0;
        lVar15 = 0;
        do {
          fVar29 = fVar29 + pfVar18[lVar15] * pfVar18[lVar15];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x20);
        fVar29 = fVar29 * 0.03125;
        if (fVar29 < 0.0) {
          fVar29 = sqrtf(fVar29);
        }
        else {
          fVar29 = SQRT(fVar29);
        }
        lVar15 = 0;
        do {
          pfVar1 = pfVar18 + lVar15;
          fVar39 = *pfVar1;
          fVar41 = pfVar1[1];
          fVar48 = pfVar1[2];
          fVar9 = pfVar1[3];
          weights[lVar15] = ABS(fVar39) + fVar29;
          weights[lVar15 + 1] = ABS(fVar41) + fVar29;
          weights[lVar15 + 2] = ABS(fVar48) + fVar29;
          weights[lVar15 + 3] = ABS(fVar9) + fVar29;
          lVar15 = lVar15 + 4;
        } while (lVar15 != 0x20);
        auVar34._0_4_ =
             make_qkx2_quants(0x20,0x1f,x + lVar19 * 0x20,weights,L + lVar19 * 0x20,mins + lVar19,
                              Laux,-0.5,ABS(fVar39) + fVar29,0xf,false);
        auVar12 = _DAT_0014e800;
        auVar11 = _DAT_0014e740;
        scales[lVar19] = auVar34._0_4_;
        auVar34._4_4_ = mins[lVar19];
        auVar34._8_4_ = extraout_XMM0_Db;
        auVar34._12_4_ = 0;
        auVar30 = maxps(auVar34,auVar30);
        lVar19 = lVar19 + 1;
        pfVar18 = pfVar18 + 0x20;
      } while (lVar19 != 8);
      uVar16 = 0;
      uVar49 = (uint)DAT_0014a020;
      uVar51 = DAT_0014a020._4_4_;
      do {
        fVar29 = scales[uVar16] *
                 (float)(-(uint)(0.0 < auVar30._0_4_) & (uint)(63.0 / auVar30._0_4_)) + 12582912.0;
        bVar13 = SUB41(fVar29,0);
        if (0x3e < ((uint)fVar29 & 0xff)) {
          bVar13 = 0x3f;
        }
        uVar17 = (uint)(mins[uVar16] *
                        (float)(-(uint)(0.0 < auVar30._4_4_) & (uint)(63.0 / auVar30._4_4_)) +
                       12582912.0) & 0xff;
        if (0x3e < uVar17) {
          uVar17 = 0x3f;
        }
        if (uVar16 < 4) {
          puVar21[uVar16 - 4] = bVar13;
          puVar21[uVar16] = (byte)uVar17;
        }
        else {
          puVar21[uVar16] = (byte)(uVar17 << 4) | bVar13 & 0xf;
          puVar21[uVar16 - 8] = puVar21[uVar16 - 8] | (bVar13 & 0x30) << 2;
          puVar21[uVar16 - 4] = puVar21[uVar16 - 4] | ((byte)uVar17 & 0x30) << 2;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != 8);
      auVar30 = divps(auVar30,_DAT_0014e7e0);
      uVar17 = auVar30._0_4_;
      uVar31 = auVar30._4_4_;
      uVar32 = uVar17 * 2 ^ 0x80000000;
      uVar35 = uVar31 * 2 ^ 0x80000000;
      uVar36 = -(uint)(-0xf000001 < (int)uVar32);
      uVar38 = -(uint)(-0xf000001 < (int)uVar35);
      fVar29 = (float)(~uVar36 & 0x40000000 |
                      SUB164(auVar30 & _DAT_0014e620,0) + 0x7800000U & uVar36) +
               (float)(uVar17 & uVar49) * 5.192297e+33 * 7.70372e-34;
      fVar39 = (float)(~uVar38 & 0x40000000 |
                      SUB164(auVar30 & _DAT_0014e620,4) + 0x7800000U & uVar38) +
               (float)(uVar31 & uVar51) * 5.192297e+33 * 7.70372e-34;
      auVar37._0_4_ = ((uint)fVar29 & 0xfff) + ((uint)fVar29 >> 0xd & 0x7c00);
      auVar37._4_4_ = ((uint)fVar39 & 0xfff) + ((uint)fVar39 >> 0xd & 0x7c00);
      auVar37._8_8_ = 0;
      auVar33._0_4_ = -(uint)(0x7f000000 < (int)uVar32);
      auVar33._4_4_ = -(uint)(0x7f000000 < (int)uVar35);
      auVar33._8_4_ = -(uint)(0 < (int)(auVar30._8_4_ * 2 ^ 0x80000000));
      auVar33._12_4_ = -(uint)(0 < (int)(auVar30._12_4_ * 2 ^ 0x80000000));
      auVar45._0_4_ = uVar17 >> 0x10;
      auVar45._4_4_ = uVar31 >> 0x10;
      auVar45._8_4_ = auVar30._8_4_ >> 0x10;
      auVar45._12_4_ = auVar30._12_4_ >> 0x10;
      auVar34 = auVar33 & _DAT_0014e690 | auVar45 & _DAT_0014e670 | ~auVar33 & auVar37;
      auVar30 = pshuflw(auVar45 & _DAT_0014e670,auVar34,0xe8);
      y[lVar20].field_0.dm = auVar30._0_4_;
      fVar29 = ggml_table_f32_f16[auVar34._0_4_];
      puVar22 = L;
      uVar16 = 0;
      pfVar18 = x;
      do {
        if (uVar16 < 4) {
          bVar24 = y[lVar20].scales[uVar16] & 0x3f;
          bVar13 = y[lVar20].scales[uVar16 + 4] & 0x3f;
        }
        else {
          bVar24 = y[lVar20].scales[uVar16 - 4] >> 2 & 0x30 | y[lVar20].scales[uVar16 + 4] & 0xf;
          bVar13 = y[lVar20].scales[uVar16] >> 2 & 0x30 | y[lVar20].scales[uVar16 + 4] >> 4;
        }
        auVar30._0_4_ = (float)bVar24 * fVar29;
        if ((auVar30._0_4_ != 0.0) || (NAN(auVar30._0_4_))) {
          fVar39 = (float)bVar13 * ggml_table_f32_f16[auVar34._4_4_];
          auVar30._4_4_ = auVar30._0_4_;
          auVar30._8_4_ = auVar30._0_4_;
          auVar30._12_4_ = auVar30._0_4_;
          lVar19 = 0;
          do {
            pfVar1 = pfVar18 + lVar19;
            auVar44._0_4_ = *pfVar1 + fVar39;
            auVar44._4_4_ = pfVar1[1] + fVar39;
            auVar44._8_4_ = pfVar1[2] + fVar39;
            auVar44._12_4_ = pfVar1[3] + fVar39;
            auVar45 = divps(auVar44,auVar30);
            fVar41 = auVar45._0_4_ + 12582912.0;
            fVar48 = auVar45._4_4_ + 12582912.0;
            auVar46._0_8_ = CONCAT44(fVar48,fVar41) & 0x7fffff007fffff;
            auVar46._8_4_ = (uint)(auVar45._8_4_ + 12582912.0) & 0x7fffff;
            auVar46._12_4_ = (uint)(auVar45._12_4_ + 12582912.0) & 0x7fffff;
            auVar50._0_4_ = -(uint)((int)((uint)fVar41 & 0x7fffff) < auVar12._0_4_);
            auVar50._4_4_ = -(uint)((int)((uint)fVar48 & 0x7fffff) < auVar12._4_4_);
            auVar50._8_4_ = -(uint)((int)auVar46._8_4_ < auVar12._8_4_);
            auVar50._12_4_ = -(uint)((int)auVar46._12_4_ < auVar12._12_4_);
            auVar45 = ~auVar50 & auVar12 | auVar46 & auVar50;
            auVar47._0_4_ = -(uint)(0x400000 < auVar45._0_4_);
            auVar47._4_4_ = -(uint)(0x400000 < auVar45._4_4_);
            auVar47._8_4_ = -(uint)(0x400000 < auVar45._8_4_);
            auVar47._12_4_ = -(uint)(0x400000 < auVar45._12_4_);
            auVar45 = auVar47 & auVar45 & auVar11;
            sVar6 = auVar45._0_2_;
            cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar45[0] - (0xff < sVar6);
            sVar6 = auVar45._2_2_;
            sVar40 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar45[2] - (0xff < sVar6),cVar2);
            sVar6 = auVar45._4_2_;
            cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar45[4] - (0xff < sVar6);
            sVar6 = auVar45._6_2_;
            uVar42 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar45[6] - (0xff < sVar6),
                              CONCAT12(cVar3,sVar40));
            sVar6 = auVar45._8_2_;
            cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar45[8] - (0xff < sVar6);
            sVar6 = auVar45._10_2_;
            uVar43 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar45[10] - (0xff < sVar6),
                              CONCAT14(cVar4,uVar42));
            sVar6 = auVar45._12_2_;
            cVar5 = (0 < sVar6) * (sVar6 < 0x100) * auVar45[0xc] - (0xff < sVar6);
            sVar8 = auVar45._14_2_;
            sVar6 = (short)((uint)uVar42 >> 0x10);
            sVar7 = (short)((uint6)uVar43 >> 0x20);
            sVar8 = (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar45[0xe] - (0xff < sVar8),
                                     CONCAT16(cVar5,uVar43)) >> 0x30);
            *(uint *)(puVar22 + lVar19) =
                 CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                          CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                                   CONCAT11((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                            (0 < sVar40) * (sVar40 < 0x100) * cVar2 -
                                            (0xff < sVar40))));
            lVar19 = lVar19 + 4;
          } while (lVar19 != 0x20);
        }
        uVar16 = uVar16 + 1;
        puVar22 = puVar22 + 0x20;
        pfVar18 = pfVar18 + 0x20;
      } while (uVar16 != 8);
      puVar22 = y[lVar20].qs;
      pbVar10 = y + lVar20;
      pbVar10->qh[0x10] = '\0';
      pbVar10->qh[0x11] = '\0';
      pbVar10->qh[0x12] = '\0';
      pbVar10->qh[0x13] = '\0';
      pbVar10->qh[0x14] = '\0';
      pbVar10->qh[0x15] = '\0';
      pbVar10->qh[0x16] = '\0';
      pbVar10->qh[0x17] = '\0';
      pbVar10 = y + lVar20;
      pbVar10->qh[0x18] = '\0';
      pbVar10->qh[0x19] = '\0';
      pbVar10->qh[0x1a] = '\0';
      pbVar10->qh[0x1b] = '\0';
      pbVar10->qh[0x1c] = '\0';
      pbVar10->qh[0x1d] = '\0';
      pbVar10->qh[0x1e] = '\0';
      pbVar10->qh[0x1f] = '\0';
      pbVar10 = y + lVar20;
      pbVar10->qh[0] = '\0';
      pbVar10->qh[1] = '\0';
      pbVar10->qh[2] = '\0';
      pbVar10->qh[3] = '\0';
      pbVar10->qh[4] = '\0';
      pbVar10->qh[5] = '\0';
      pbVar10->qh[6] = '\0';
      pbVar10->qh[7] = '\0';
      pbVar10 = y + lVar20;
      pbVar10->qh[8] = '\0';
      pbVar10->qh[9] = '\0';
      pbVar10->qh[10] = '\0';
      pbVar10->qh[0xb] = '\0';
      pbVar10->qh[0xc] = '\0';
      pbVar10->qh[0xd] = '\0';
      pbVar10->qh[0xe] = '\0';
      pbVar10->qh[0xf] = '\0';
      bVar13 = 1;
      bVar24 = 2;
      puVar23 = L + 0x20;
      uVar16 = 0;
      do {
        lVar19 = 0;
        do {
          bVar25 = puVar23[lVar19 + -0x20];
          if (0xf < bVar25) {
            bVar25 = bVar25 - 0x10;
            puVar27[lVar19] = puVar27[lVar19] | bVar13;
          }
          bVar26 = puVar23[lVar19];
          if (0xf < bVar26) {
            bVar26 = bVar26 - 0x10;
            puVar27[lVar19] = puVar27[lVar19] | bVar24;
          }
          puVar22[lVar19] = bVar26 << 4 | bVar25;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0x20);
        bVar13 = bVar13 << 2;
        bVar24 = bVar24 << 2;
        puVar22 = puVar22 + 0x20;
        puVar23 = puVar23 + 0x40;
        bVar28 = uVar16 < 0xc0;
        uVar16 = uVar16 + 0x40;
      } while (bVar28);
      x = x + 0x100;
      lVar20 = lVar20 + 1;
      puVar21 = puVar21 + 0xb0;
      puVar27 = puVar27 + 0xb0;
    } while (lVar20 != lVar14 >> 8);
  }
  return;
}

Assistant:

void quantize_row_q5_K_ref(const float * GGML_RESTRICT x, block_q5_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    uint8_t L[QK_K];
    float mins[QK_K/32];
    float scales[QK_K/32];
    float weights[32];
    uint8_t Laux[32];

    for (int i = 0; i < nb; i++) {
        float max_scale = 0; // as we are deducting the min, scales are always positive
        float max_min = 0;
        for (int j = 0; j < QK_K/32; ++j) {
            //scales[j] = make_qkx1_quants(32, 31, x + 32*j, L + 32*j, &mins[j], 9, 0.5f);
            float sum_x2 = 0;
            for (int l = 0; l < 32; ++l) sum_x2 += x[32*j + l] * x[32*j + l];
            float av_x = sqrtf(sum_x2/32);
            for (int l = 0; l < 32; ++l) weights[l] = av_x + fabsf(x[32*j + l]);
            scales[j] = make_qkx2_quants(32, 31, x + 32*j, weights, L + 32*j, &mins[j], Laux, -0.5f, 0.1f, 15, false);
            float scale = scales[j];
            if (scale > max_scale) {
                max_scale = scale;
            }
            float min = mins[j];
            if (min > max_min) {
                max_min = min;
            }
        }

        float inv_scale = max_scale > 0 ? 63.f/max_scale : 0.f;
        float inv_min   = max_min   > 0 ? 63.f/max_min   : 0.f;
        for (int j = 0; j < QK_K/32; ++j) {
            uint8_t ls = nearest_int(inv_scale*scales[j]);
            uint8_t lm = nearest_int(inv_min*mins[j]);
            ls = MIN(63, ls);
            lm = MIN(63, lm);
            if (j < 4) {
                y[i].scales[j] = ls;
                y[i].scales[j+4] = lm;
            } else {
                y[i].scales[j+4] = (ls & 0xF) | ((lm & 0xF) << 4);
                y[i].scales[j-4] |= ((ls >> 4) << 6);
                y[i].scales[j-0] |= ((lm >> 4) << 6);
            }
        }
        y[i].d = GGML_FP32_TO_FP16(max_scale/63.f);
        y[i].dmin = GGML_FP32_TO_FP16(max_min/63.f);

        uint8_t sc, m;
        for (int j = 0; j < QK_K/32; ++j) {
            get_scale_min_k4(j, y[i].scales, &sc, &m);
            const float d = GGML_FP16_TO_FP32(y[i].d) * sc;
            if (!d) continue;
            const float dm = GGML_FP16_TO_FP32(y[i].dmin) * m;
            for (int ii = 0; ii < 32; ++ii) {
                int l = nearest_int((x[32*j + ii] + dm)/d);
                l = MAX(0, MIN(31, l));
                L[32*j + ii] = l;
            }
        }

        uint8_t * GGML_RESTRICT qh = y[i].qh;
        uint8_t * GGML_RESTRICT ql = y[i].qs;
        memset(qh, 0, QK_K/8);

        uint8_t m1 = 1, m2 = 2;
        for (int n = 0; n < QK_K; n += 64) {
            for (int j = 0; j < 32; ++j) {
                int l1 = L[n + j];
                if (l1 > 15) {
                    l1 -= 16; qh[j] |= m1;
                }
                int l2 = L[n + j + 32];
                if (l2 > 15) {
                    l2 -= 16; qh[j] |= m2;
                }
                ql[j] = l1 | (l2 << 4);
            }
            m1 <<= 2; m2 <<= 2;
            ql += 32;
        }

        x += QK_K;
    }
}